

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NameSyntax *args_2;
  DefaultExtendsClauseArgSyntax *args_1;
  ExtendsClauseSyntax *pEVar1;
  Token TVar2;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  ArgumentListSyntax *in_stack_ffffffffffffffb0;
  ArgumentListSyntax *local_48;
  BumpAllocator *this;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  this = TVar2._0_8_;
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0xa56fb3);
  args_2 = deepClone<slang::syntax::NameSyntax>
                     ((NameSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (*(long *)(__fn + 0x30) == 0) {
    local_48 = (ArgumentListSyntax *)0x0;
  }
  else {
    local_48 = deepClone<slang::syntax::ArgumentListSyntax>
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  if (*(long *)(__fn + 0x38) == 0) {
    args_1 = (DefaultExtendsClauseArgSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::DefaultExtendsClauseArgSyntax>
                       ((DefaultExtendsClauseArgSyntax *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  }
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExtendsClauseSyntax,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*,slang::syntax::DefaultExtendsClauseArgSyntax*>
                     (this,(Token *)local_48,(NameSyntax *)args_1,(ArgumentListSyntax **)args_2,
                      (DefaultExtendsClauseArgSyntax **)__child_stack);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExtendsClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExtendsClauseSyntax>(
        node.keyword.deepClone(alloc),
        *deepClone<NameSyntax>(*node.baseName, alloc),
        node.arguments ? deepClone(*node.arguments, alloc) : nullptr,
        node.defaultedArg ? deepClone(*node.defaultedArg, alloc) : nullptr
    );
}